

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O1

_Bool borg_leave_level(_Bool bored)

{
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  if ((borg.goal.recalling == L'\0') || (borg.trait[0x69] == 1)) {
    wVar2 = borg.trait[0x69];
    if ((wVar2 == L'd') && ((morgoth_on_level && ((int)borg_t - (int)borg_t_morgoth < 5000)))) {
      borg.goal._12_3_ = borg.goal._12_3_ & 0xff0000;
      bored = false;
    }
    if (wVar2 == L'\0') {
      borg.goal._12_3_ = borg.goal._12_3_ & 0xffff00;
      if (bored == false) goto LAB_002470e4;
      if (((borg.trait[0x6a] == 100) && (borg_cfg[10] == 0)) &&
         (pcVar4 = borg_restock(L'd'), pcVar4 != (char *)0x0)) {
        borg.goal.leaving = true;
        borg.goal.fleeing = true;
        borg.stair_more = true;
        borg_note("# Borg must crawl to deep dungeon- no recall to 100.");
LAB_00247252:
        _Var1 = borg_flow_stair_more(6,false,false);
        return _Var1;
      }
      if ((((borg.trait[0x6a] < (int)((uint)(borg_cfg[9] != 0) * 2 + 8)) || (borg.trait[0x26] < 3))
          || ((pcVar4 = borg_prepared((uint)(borg.trait[0x6a] * 6) / 10), pcVar4 != (char *)0x0 &&
              (borg_cfg[10] == 0)))) || (_Var1 = borg_recall(), !_Var1)) {
        if (borg.trait[0x6a] < (int)((uint)(borg_cfg[9] != 0) * 2 + 8)) {
          pcVar4 = "# Not deep enough to recall";
        }
        else if (borg.trait[0x26] < 3) {
          pcVar4 = "# Not enough recalls to recall";
        }
        else {
          pcVar4 = borg_prepared((uint)(borg.trait[0x6a] * 6) / 10);
          if (pcVar4 == (char *)0x0) {
            pcVar4 = "# failed to recall when I wanted to";
          }
          else {
            borg_prepared(borg.trait[0x6a]);
            pcVar4 = format("# Way too scary to recall down there!   %s");
          }
        }
        borg_note(pcVar4);
        borg.goal.leaving = true;
        borg.goal.fleeing = true;
        borg.stair_more = true;
        goto LAB_00247252;
      }
      pcVar4 = "# Recalling into dungeon.";
    }
    else {
      pcVar4 = borg_prepared(wVar2);
      pcVar5 = borg_prepared(borg.trait[0x69] + L'\x01');
      if (pcVar4 == (char *)0x0) {
        iVar8 = 0;
      }
      else {
        pcVar6 = format("# heading up, not prep for current level: %s)");
        borg_note(pcVar6);
        iVar8 = -1;
      }
      wVar2 = borg_count_sell();
      bVar7 = L'\v' < wVar2;
      if (pcVar4 != (char *)0x0) {
        bVar7 = borg.trait[0x7d] != 0 || L'\v' < wVar2;
      }
      if ((pcVar5 != (char *)0x0 & bored) == 1) {
        pcVar5 = format("# heading up (bored and unable to dive: %s)");
LAB_002469d0:
        borg_note(pcVar5);
        iVar8 = -1;
      }
      else {
        if ((bored != false) && (borg.trait[0x1b] < (int)avoidance)) {
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "# heading down (bored and spastic).";
            goto LAB_00246b2f;
          }
          pcVar5 = "# heading up (bored and spastic).";
          goto LAB_002469d0;
        }
        if (!bVar7) {
          pcVar6 = borg_prepared(borg.trait[0x69] + L'\x05');
          if ((wVar2 < L'\r') && (pcVar6 == (char *)0x0)) {
            pcVar5 = "# power dive, playing too shallow.";
          }
          else {
            if ((pcVar5 != (char *)0x0) || (0x18 < borg.trait[0x69] - 0x4bU)) goto LAB_00246b3a;
            pcVar5 = "# power dive, head deep.";
          }
LAB_00246b2f:
          borg_note(pcVar5);
          iVar8 = 1;
        }
      }
LAB_00246b3a:
      if (pcVar4 == (char *)0x0) {
        bVar10 = false;
      }
      else {
        if (unique_on_level == 0) {
          if (((iVar8 == 0) && (pcVar5 = borg_prepared(borg.trait[0x6a] / 2), pcVar5 != (char *)0x0)
              ) && (0x41 < borg.trait[0x6a])) {
            iVar8 = 0;
            pcVar5 = format("# Returning to town (too deep: %s)",pcVar4);
            borg_note(pcVar5);
            borg.goal.rising = true;
          }
          else {
            pcVar5 = format("# Climbing (too deep: %s)",pcVar4);
            borg_note(pcVar5);
            iVar8 = -1;
          }
        }
        pcVar5 = borg_must_return_to_town();
        bVar10 = pcVar5 != (char *)0x0;
        if (bVar10) {
          pcVar5 = borg_must_return_to_town();
          pcVar5 = format("# returning to town to restock(too deep: %s)",pcVar5);
          borg_note(pcVar5);
          borg.goal.rising = true;
        }
        pcVar4 = strstr(pcVar4,"Collect from house");
        if (pcVar4 != (char *)0x0) {
          borg_note("# Returning to town to Collect stock.");
          borg.goal.rising = true;
          bVar10 = true;
        }
      }
      pcVar4 = borg_prepared(borg.trait[0x69] + L'\x14');
      if (((pcVar4 == (char *)0x0) &&
          (pcVar4 = borg_prepared((borg.trait[0x6a] * 6) / 10), pcVar4 == (char *)0x0)) &&
         ((borg.trait[0x69] + 0x14 < borg.trait[0x6a] &&
          ((2 < borg.trait[0x26] || (2000 < borg.trait[0x2d])))))) {
        borg_note("# returning to town to recall back down (too shallow)");
        borg.goal.rising = true;
      }
      if ((((borg_cfg[9] != 0) || (borg.trait[0x24] < 0xf)) && (L'\v' < wVar2)) &&
         (borg.trait[0x24] < 0x1a)) {
        borg_note("# Going to town (Sell Stuff, Worshipping Gold).");
        borg.goal.rising = true;
      }
      if (((bored != false) && (L'\v' < wVar2)) && (0x19 < borg.trait[0x24])) {
        borg_note("# Going to town (Sell Stuff).");
        borg.goal.rising = true;
      }
      if (borg.trait[0x7c] != 0) {
        borg_note("# Going to town (Fix Level).");
        borg.goal.rising = true;
      }
      if (((bored != false) && (borg.trait[0x7d] != 0)) && (borg.trait[0x23] != 0x32)) {
        borg_note("# Going to town (Fix Experience).");
        borg.goal.rising = true;
      }
      if ((((((bored != false) && (borg.goal.rising == false)) && (vault_on_level == false)) &&
           ((borg_fighting_unique == L'\0' && (8000 < (borg_t + borg_time_town) - borg_began)))) ||
          (12000 < (borg_t + borg_time_town) - borg_began)) &&
         ((borg.trait[0x6a] < 99 || (unique_on_level == 0)))) {
        borg_note("# Going to town (I miss my home).");
        borg.goal.rising = true;
      }
      if (((borg.trait[0x69] < 0xd) && (borg.trait[0x69] + 10 <= borg.trait[0x6a])) &&
         (0xdac < (borg_t + borg_time_town) - borg_began)) {
        borg_note("# Going to town (scumming check).");
        borg.goal.rising = true;
      }
      if (((vault_on_level == false) && (borg.trait[0x108] != 0)) &&
         ((2 < borg.trait[0xd7] || (0 < borg.trait[0xd8])))) {
        borg_note("# Going to town (Dropping off Potions).");
        borg.goal.rising = true;
      }
      if (((borg.trait[0x69] == 99) && (borg.trait[0x107] != 0)) && (borg.ready_morgoth != L'\x01'))
      {
        borg_note("# Returning to level 98 to scum for items.");
        iVar8 = -1;
      }
      if (borg.trait[0x6b] != 0) {
        iVar8 = 1;
      }
      if ((borg.trait[0x69] < 100) && (pcVar4 = borg_prepared(L'c'), pcVar4 == (char *)0x0)) {
        iVar8 = 1;
      }
      if ((iVar8 == 0) && (iVar8 = 0, borg_cfg[0x10] < borg.trait[0x69])) {
        pcVar4 = format("# Going up a bit (No Deeper than %d).");
        borg_note(pcVar4);
        iVar8 = -1;
      }
      iVar9 = -(uint)borg.goal.rising;
      if (iVar8 != 0) {
        iVar9 = iVar8;
      }
      if ((((10 < borg.trait[0x23]) && (borg.trait[0x69] == 1)) && (iVar9 < 0)) &&
         ((borg_t - borg_began < 200 && (iVar9 = -1, 1 < borg.trait[0x27])))) {
        borg_note("# Staying on level 1 to rotate shops.");
        iVar9 = 0;
      }
      if (iVar9 == 0) {
        iVar8 = borg.trait[0x23];
        if (iVar8 < 5 || borg_feeling_stuff == L'\0') {
          if (iVar8 < 10) {
            iVar8 = iVar8 * 0x32;
          }
          else if ((iVar8 < 0xf) && (borg.trait[0x27] < 3)) {
            iVar8 = 2000;
            if (borg.trait[0x32] == 0) {
              iVar8 = 0x9c4;
            }
          }
          else {
            if (borg_feeling_stuff != L'\0' || 0x13 < borg.trait[0x24]) goto LAB_00246f7d;
            iVar8 = (uint)z_info->feeling_need * 10;
          }
        }
        else {
LAB_00246f7d:
          iVar8 = borg_stuff_feeling[borg_feeling_stuff];
          if (bored != false) {
            iVar8 = iVar8 / 10;
          }
        }
        iVar9 = 0;
        if ((iVar8 < borg_t - borg_began) &&
           ((borg.trait[0x6a] < 99 || (iVar9 = 0, unique_on_level == 0)))) {
          pcVar4 = format("# Spent too long (%ld) on level, leaving.");
          borg_note(pcVar4);
          iVar9 = -1;
          if (!bVar7) {
            uVar3 = Rand_div(100);
            iVar9 = (uint)(0x31 < (int)uVar3) * 2 + -1;
          }
        }
      }
      if (-1 < iVar9) {
LAB_002470c4:
        if (0 < iVar9) {
          borg.stair_more = true;
          _Var1 = borg_flow_stair_more(6,false,false);
          if (_Var1) {
            return true;
          }
        }
        goto LAB_002470e4;
      }
      if ((player->opts).opt[0x20] == false) {
        borg_note("# Looking for up stairs.  Going up.");
        borg.stair_less = true;
      }
      if ((borg.trait[0x69] < 100) || (pcVar4 = borg_prepared(L'c'), pcVar4 == (char *)0x0)) {
        if ((borg.goal.rising == true) &&
           (((200 < (borg_time_town - borg_began) + (int)borg_t && (4 < borg.trait[0x69])) &&
            (_Var1 = borg_recall(), _Var1)))) {
          pcVar4 = "# Recalling to town (goal rising)";
          goto LAB_002471c3;
        }
        if (((bVar10) && (4 < borg.trait[0x69])) && (_Var1 = borg_recall(), _Var1)) {
          borg_note("# Recalling to town (need to restock)");
        }
      }
      _Var1 = borg_flow_stair_less(6,false);
      if (_Var1) {
        pcVar4 = "# Going to stairs up. I\'m bored.";
      }
      else {
        borg_note("# Bored but unable to flow to up stairs.");
        if ((((bored & borg.goal.rising) != 1) || (borg_t - borg_began < 1000)) ||
           (_Var1 = borg_recall(), !_Var1)) {
          if (track_less.num == 0) {
            borg_note("# no up stairs found, going down");
            iVar9 = 1;
          }
          goto LAB_002470c4;
        }
        pcVar4 = "# Recalling to town (no stairs)";
      }
    }
LAB_002471c3:
    borg_note(pcVar4);
    _Var1 = true;
  }
  else {
LAB_002470e4:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool borg_leave_level(bool bored)
{
    int  sellable_item_count, g = 0;
    bool try_not_to_descend = false;

    bool need_restock       = false;

    /* Hack -- waiting for "recall" other than depth 1 */
    if (borg.goal.recalling && borg.trait[BI_CDEPTH] != 1)
        return false;

    /* Not bored if I have seen Morgoth recently */
    if (borg.trait[BI_CDEPTH] == 100 && morgoth_on_level
        && (borg_t - borg_t_morgoth < 5000)) {
        borg.goal.leaving = false;
        borg.goal.rising  = false;
        bored             = false;
    }

    /* There is a great concern about recalling back to level 100.
     * Often the borg will fall down a trap door to level 100 when he is not
     * prepared to be there.  Some classes can use Teleport Level to get
     * back up to 99,  But Warriors cannot.  Realistically the borg needs
     * be be able to scum deep in the dungeon.  But he cannot risk being
     * on 100 and using the few *Healing* pots that he managed to collect.
     * It is better for warriors to walk all the way down to 98 and scum.
     * It seems like a long and nasty crawl, but it is the best way to
     * make sure the borg survives.  Along the way he will collect the
     * Healing, Life and *Healing* that he needs.
     *
     * The other classes (or at least those who can use the Teleport Level
     * spell) will not need to do this nasty crawl.  Risky Borgs will
     * not crawl either.
     */

    /* Town */
    if (!borg.trait[BI_CDEPTH]) {
        /* Cancel rising */
        borg.goal.rising = false;

        /* Wait until bored */
        if (!bored)
            return false;

        /* Case for those who cannot Teleport Level */
        if (borg.trait[BI_MAXDEPTH] == 100 && !borg_cfg[BORG_PLAYS_RISKY]) {
            if (borg_restock(100)) {
                /* These pple must crawl down to 100, Sorry */
                borg.goal.fleeing = true;
                borg.goal.leaving = true;
                borg.stair_more   = true;

                /* Note */
                borg_note(
                    "# Borg must crawl to deep dungeon- no recall to 100.");

                /* Attempt to use those stairs */
                if (borg_flow_stair_more(GOAL_BORE, false, false))
                    return true;

                /* Oops */
                return false;
            }
        }

        /* Hack -- Recall into dungeon */
        if ((borg.trait[BI_MAXDEPTH] >= (borg_cfg[BORG_WORSHIPS_GOLD] ? 10 : 8))
            && (borg.trait[BI_RECALL] >= 3)
            && (((char *)NULL
                    == borg_prepared(borg.trait[BI_MAXDEPTH] * 6 / 10))
                || borg_cfg[BORG_PLAYS_RISKY])
            && borg_recall()) {
            /* Note */
            borg_note("# Recalling into dungeon.");

            /* Give it a shot */
            return true;
        } else {
            /* note why we didn't recall. */
            if (borg.trait[BI_MAXDEPTH]
                < (borg_cfg[BORG_WORSHIPS_GOLD] ? 10 : 8)) {
                borg_note("# Not deep enough to recall");
            } else {
                if (borg.trait[BI_RECALL] <= 2) {
                    borg_note("# Not enough recalls to recall");
                } else {
                    /* recall unless way out of our league */
                    if ((char *)NULL
                        != borg_prepared(borg.trait[BI_MAXDEPTH] * 6 / 10)) {
                        borg_note(
                            format("# Way too scary to recall down there!   %s",
                                borg_prepared(borg.trait[BI_MAXDEPTH])));
                    } else {
                        borg_note("# failed to recall when I wanted to");
                    }
                }
            }
            borg.goal.fleeing = true;
            borg.goal.leaving = true;
        }

        borg.stair_more = true;

        /* Attempt to use those stairs */
        if (borg_flow_stair_more(GOAL_BORE, false, false))
            return true;

        /* Oops */
        return false;
    }

    /** In the Dungeon **/
    const char *prep_cur_depth  = borg_prepared(borg.trait[BI_CDEPTH]);
    const char *prep_next_depth = borg_prepared(borg.trait[BI_CDEPTH] + 1);

    /* if not prepared for this level, head upward */
    if (NULL != prep_cur_depth) {
        g = -1;
        borg_note(format(
            "# heading up, not prep for current level: %s)", prep_cur_depth));
    }

    /* Count sellable items */
    sellable_item_count = borg_count_sell();

    /* Do not dive when "full" of items */
    if (sellable_item_count >= 12)
        try_not_to_descend = true;

    /* Do not dive when drained */
    if (g && borg.trait[BI_ISFIXEXP])
        try_not_to_descend = true;

    /* Rise a level if bored and unable to dive. */
    if (bored && (NULL != prep_next_depth)) {
        g = -1;
        borg_note(format(
            "# heading up (bored and unable to dive: %s)", prep_next_depth));
    }

    /* Rise a level if bored and spastic. */
    else if (bored && avoidance > borg.trait[BI_CURHP]) {
        if (NULL != prep_next_depth) {
            g = -1;
            borg_note("# heading up (bored and spastic).");
        } else {
            g = 1;
            borg_note("# heading down (bored and spastic).");
        }
    }

    /* Power dive if I am playing too shallow*/
    else if (!try_not_to_descend
             && NULL == borg_prepared(borg.trait[BI_CDEPTH] + 5)
             && sellable_item_count < 13) {
        g = 1;
        borg_note("# power dive, playing too shallow.");
    }

    /* Power dive if I am playing deep */
    else if (!try_not_to_descend && NULL == prep_next_depth
             && borg.trait[BI_CDEPTH] >= 75 && borg.trait[BI_CDEPTH] < 100) {
        g = 1;
        borg_note("# power dive, head deep.");
    }

    /* Hack -- Power-climb upwards when needed */
    if (NULL != prep_cur_depth) {
        /* Certain checks are bypassed if Unique monster on level */
        if (!unique_on_level) {
            /* if I am really out of depth go to town */
            if (!g && NULL != borg_prepared(borg.trait[BI_MAXDEPTH] * 5 / 10)
                && borg.trait[BI_MAXDEPTH] > 65) {
                borg_note(format(
                    "# Returning to town (too deep: %s)", prep_cur_depth));
                borg.goal.rising = true;
            } else {
                borg_note(format("# Climbing (too deep: %s)", prep_cur_depth));
                g = -1;
            }
        }

        /* if I must go to town without delay */
        if (NULL != borg_must_return_to_town()) {
            borg_note(format("# returning to town to restock(too deep: %s)",
                borg_must_return_to_town()));
            borg.goal.rising = true;
            need_restock     = true;
        }

        /* I must return to collect stock from the house. */
        if (strstr(prep_cur_depth, "Collect from house")) {
            borg_note("# Returning to town to Collect stock.");
            borg.goal.rising = true;
            need_restock     = true;
        }
    }

    /* Hack -- if I am playing way too shallow return to town */
    if (NULL == borg_prepared(borg.trait[BI_CDEPTH] + 20)
        && NULL == borg_prepared(borg.trait[BI_MAXDEPTH] * 6 / 10)
        && borg.trait[BI_MAXDEPTH] > borg.trait[BI_CDEPTH] + 20
        && (borg.trait[BI_RECALL] >= 3 || borg.trait[BI_GOLD] > 2000)) {
        borg_note("# returning to town to recall back down (too shallow)");
        borg.goal.rising = true;
    }

    /* Return to town to sell stuff -- No recall allowed.*/
    if (((borg_cfg[BORG_WORSHIPS_GOLD] || borg.trait[BI_MAXCLEVEL] < 15)
            && borg.trait[BI_MAXCLEVEL] <= 25)
        && (sellable_item_count >= 12)) {
        borg_note("# Going to town (Sell Stuff, Worshipping Gold).");
        borg.goal.rising = true;
    }

    /* Return to town to sell stuff (use Recall) */
    if ((bored && borg.trait[BI_MAXCLEVEL] >= 26)
        && (sellable_item_count >= 12)) {
        borg_note("# Going to town (Sell Stuff).");
        borg.goal.rising = true;
    }

    /* Return to town when level drained */
    if (borg.trait[BI_ISFIXLEV]) {
        borg_note("# Going to town (Fix Level).");
        borg.goal.rising = true;
    }

    /* Return to town to restore experience */
    if (bored && borg.trait[BI_ISFIXEXP] && borg.trait[BI_CLEVEL] != 50) {
        borg_note("# Going to town (Fix Experience).");
        borg.goal.rising = true;
    }

    /* return to town if it has been a while */
    if ((!borg.goal.rising && bored && !vault_on_level && !borg_fighting_unique
        && borg_time_town + borg_t - borg_began > 8000)
        || (borg_time_town + borg_t - borg_began > 12000)) {
        /* don't get bored when hunting uniques */
        if (borg.trait[BI_MAXDEPTH] < 99 || !unique_on_level) {
            borg_note("# Going to town (I miss my home).");
            borg.goal.rising = true;
        }
    }

    /* return to town if been scumming for a bit */
    if (borg.trait[BI_MAXDEPTH] >= borg.trait[BI_CDEPTH] + 10
        && borg.trait[BI_CDEPTH] <= 12
        && borg_time_town + borg_t - borg_began > 3500) {
        borg_note("# Going to town (scumming check).");
        borg.goal.rising = true;
    }

    /* Return to town to drop off some scumming stuff */
    if (!vault_on_level && borg.trait[BI_PREP_BIG_FIGHT]
        && (borg.trait[BI_AEZHEAL] >= 3 || borg.trait[BI_ALIFE] >= 1)) {
        borg_note("# Going to town (Dropping off Potions).");
        borg.goal.rising = true;
    }

    /* Hack -- It is much safer to scum for items on 98
     * Check to see if depth 99, if Sauron is dead and Im not read to fight
     * the final battle
     */
    if (borg.trait[BI_CDEPTH] == 99 && borg.trait[BI_SAURON_DEAD]
        && borg.ready_morgoth != 1) {
        borg_note("# Returning to level 98 to scum for items.");
        g = -1;
    }

    /* Power dive if Morgoth is dead */
    if (borg.trait[BI_KING])
        g = 1;

    /* Power dive to 99 if ready */
    if (borg.trait[BI_CDEPTH] < 100 && NULL == borg_prepared(99))
        g = 1;

    /* Climb if deeper than I want to be */
    if (!g && borg.trait[BI_CDEPTH] > borg_cfg[BORG_NO_DEEPER]) {
        borg_note(format(
            "# Going up a bit (No Deeper than %d).", borg_cfg[BORG_NO_DEEPER]));
        g = -1;
    }

    /* if returning to town, try to go upstairs */
    if (!g && borg.goal.rising)
        g = -1;

    /* Mega-Hack -- spend time on the first level to rotate shops */
    if (borg.trait[BI_CLEVEL] > 10 && (borg.trait[BI_CDEPTH] == 1)
        && (borg_t - borg_began < 200) && (g < 0)
        && (borg.trait[BI_FOOD] > 1)) {
        borg_note("# Staying on level 1 to rotate shops.");
        g = 0;
    }

    /* do not hangout on boring levels for *too* long */
    if (!g && (borg_t - borg_began) > borg_time_to_stay_on_level(bored)) {
        /* don't get bored when hunting uniques */
        if (borg.trait[BI_MAXDEPTH] < 99 || !unique_on_level) {
            /* Note */
            borg_note(format("# Spent too long (%ld) on level, leaving.",
                (long int)(borg_t - borg_began)));

            /* if we are trying not to go down, go up*/
            if (try_not_to_descend)
                g = -1;
            else
                /* otherwise use random stairs */
                g = ((randint0(100) < 50) ? -1 : 1);
        }
    }

    /* Go Up */
    if (g < 0) {
        if (!OPT(player, birth_force_descend)) {
            /* Take next stairs */
            borg_note("# Looking for up stairs.  Going up.");
            borg.stair_less = true;
        }

        /* don't recall to town from 100 if we are prepared for 99 */
        if (borg.trait[BI_CDEPTH] < 100 || !borg_prepared(99)) {

            /* Hack -- recall if going to town */
            if (borg.goal.rising && ((borg_time_town + (borg_t - borg_began)) > 200)
                && (borg.trait[BI_CDEPTH] >= 5) && borg_recall()) {
                borg_note("# Recalling to town (goal rising)");
                return true;
            }

            /* Hack -- Recall if needing to Restock */
            if (need_restock && borg.trait[BI_CDEPTH] >= 5 && borg_recall()) {
                borg_note("# Recalling to town (need to restock)");
            }
        }

        /* Attempt to use stairs */
        if (borg_flow_stair_less(GOAL_BORE, false)) {
            borg_note("# Going to stairs up. I'm bored.");
            return true;
        } else {
            borg_note("# Bored but unable to flow to up stairs.");
        }

        /* Cannot find any stairs */
        if (borg.goal.rising && bored && (borg_t - borg_began) >= 1000) {
            if (borg_recall()) {
                borg_note("# Recalling to town (no stairs)");
                return true;
            }
        }

        /* No up stairs found. do down then back up */
        if (track_less.num == 0) {
            borg_note("# no up stairs found, going down");
            g = 1;
        }
    }

    /* Go Down */
    if (g > 0) {
        /* Take next stairs */
        borg.stair_more = true;

        /* Attempt to use those stairs */
        if (borg_flow_stair_more(GOAL_BORE, false, false))
            return true;
    }

    /* Failure */
    return false;
}